

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_rope_cache_init
               (float theta_base,float freq_scale,float *freq_factors,float *corr_dims,int64_t ne0,
               float ext_factor,float mscale,float *cache,float sin_sign,float theta_scale)

{
  int64_t in_RCX;
  long in_RDX;
  float in_XMM0_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float ff;
  int64_t i0;
  float theta;
  float *sin_theta;
  undefined4 in_stack_ffffffffffffffc0;
  
  for (sin_theta = (float *)0x0; (long)sin_theta < in_RDX;
      sin_theta = (float *)((long)sin_theta + 2)) {
    rope_yarn((float)((ulong)in_RDX >> 0x20),(float)in_RDX,(float *)CONCAT44(in_XMM2_Da,in_XMM3_Da),
              in_RCX,in_XMM4_Da,in_XMM5_Da,(float *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc0),
              sin_theta);
    *(float *)(in_RCX + 4 + (long)sin_theta * 4) =
         in_XMM4_Da * *(float *)(in_RCX + 4 + (long)sin_theta * 4);
    in_XMM0_Da = in_XMM5_Da * in_XMM0_Da;
  }
  return;
}

Assistant:

static void ggml_rope_cache_init(
     float theta_base, float freq_scale, const float * freq_factors, float corr_dims[2], int64_t ne0, float ext_factor, float mscale,
     float * cache, float sin_sign, float theta_scale) {
    // ref: https://github.com/jquesnelle/yarn/blob/master/scaled_rope/LlamaYaRNScaledRotaryEmbedding.py
    float theta = theta_base;
    for (int64_t i0 = 0; i0 < ne0; i0 += 2) {
        const float ff = freq_factors ? freq_factors[i0/2] : 1.0f;
        rope_yarn(
            theta/ff, freq_scale, corr_dims, i0, ext_factor, mscale, &cache[i0 + 0], &cache[i0 + 1]
        );
        cache[i0 + 1] *= sin_sign;

        theta *= theta_scale;
    }
}